

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmllint.c
# Opt level: O3

void * myMallocFunc(size_t size)

{
  int iVar1;
  void *pvVar2;
  
  iVar1 = xmlMemUsed();
  if ((long)iVar1 + size == 0) {
    pvVar2 = (void *)xmlMemMalloc(size);
    return pvVar2;
  }
  xmllintMaxmemReached = 1;
  return (void *)0x0;
}

Assistant:

static void *
myMallocFunc(size_t size) {
    void *ret;

    if (xmlMemUsed() + size > (size_t) xmllintMaxmem) {
#if XMLLINT_ABORT_ON_FAILURE
        abort();
#endif
        xmllintMaxmemReached = 1;
        xmllintOom = 1;
        return(NULL);
    }

    ret = xmlMemMalloc(size);
    if (ret == NULL)
        xmllintOom = 1;

    return(ret);
}